

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O2

XXH_errorcode VELOCYPACK_XXH32_reset(XXH32_state_t *statePtr,XXH32_hash_t seed)

{
  statePtr->total_len_32 = 0;
  statePtr->large_len = 0;
  statePtr->v1 = seed + 0x24234428;
  statePtr->v2 = seed + 0x85ebca77;
  statePtr->v3 = seed;
  statePtr->v4 = seed + 0x61c8864f;
  statePtr->mem32[0] = 0;
  statePtr->mem32[1] = 0;
  statePtr->mem32[2] = 0;
  statePtr->mem32[3] = 0;
  statePtr->memsize = 0;
  return XXH_OK;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode XXH32_reset(XXH32_state_t* statePtr,
                                         XXH32_hash_t seed) {
  XXH32_state_t state; /* using a local state to memcpy() in order to avoid
                          strict-aliasing warnings */
  memset(&state, 0, sizeof(state));
  state.v1 = seed + XXH_PRIME32_1 + XXH_PRIME32_2;
  state.v2 = seed + XXH_PRIME32_2;
  state.v3 = seed + 0;
  state.v4 = seed - XXH_PRIME32_1;
  /* do not write into reserved, planned to be removed in a future version */
  memcpy(statePtr, &state, sizeof(state) - sizeof(state.reserved));
  return XXH_OK;
}